

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall
CLI::App::_add_flag_internal(App *this,string *flag_name,callback_t *fun,string *flag_description)

{
  _Manager_type p_Var1;
  bool bVar2;
  Option *this_00;
  IncorrectConstruction *__return_storage_ptr__;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *fname;
  pointer __x;
  _Any_data local_178;
  _Manager_type local_168;
  _Invoker_type local_160;
  _Any_data local_158;
  _Manager_type local_148;
  _Invoker_type local_140;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  flag_defaults;
  string local_118;
  string local_f8;
  _Any_data local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  _Any_data local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar2 = detail::has_default_flag_values(flag_name);
  if (bVar2) {
    detail::get_default_flag_values(&flag_defaults,flag_name);
    detail::remove_default_flag_values(flag_name);
    ::std::__cxx11::string::string((string *)&local_f8,(string *)flag_name);
    local_158._M_unused._M_object = (void *)0x0;
    local_158._8_8_ = 0;
    local_148 = (_Manager_type)0x0;
    local_140 = fun->_M_invoker;
    p_Var1 = (fun->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_158._M_unused._0_8_ = (undefined8)*(undefined8 *)&(fun->super__Function_base)._M_functor
      ;
      local_158._8_8_ = *(undefined8 *)((long)&(fun->super__Function_base)._M_functor + 8);
      (fun->super__Function_base)._M_manager = (_Manager_type)0x0;
      fun->_M_invoker = (_Invoker_type)0x0;
      local_148 = p_Var1;
    }
    ::std::__cxx11::string::string((string *)&local_50,(string *)flag_description);
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8._M_unused._M_object = (void *)0x0;
    local_b8._8_8_ = 0;
    this_00 = add_option(this,&local_f8,(callback_t *)&local_158,&local_50,false,
                         (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                          *)&local_b8);
    std::_Function_base::~_Function_base((_Function_base *)&local_b8);
    ::std::__cxx11::string::~string((string *)&local_50);
    std::_Function_base::~_Function_base((_Function_base *)&local_158);
    ::std::__cxx11::string::~string((string *)&local_f8);
    for (__x = flag_defaults.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        __x != flag_defaults.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this_00->fnames_,&__x->first);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_move_assign(&this_00->default_flag_values_,&flag_defaults);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&flag_defaults);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_118,(string *)flag_name);
    local_178._M_unused._M_object = (void *)0x0;
    local_178._8_8_ = 0;
    local_168 = (_Manager_type)0x0;
    local_160 = fun->_M_invoker;
    p_Var1 = (fun->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_178._M_unused._0_8_ = (undefined8)*(undefined8 *)&(fun->super__Function_base)._M_functor
      ;
      local_178._8_8_ = *(undefined8 *)((long)&(fun->super__Function_base)._M_functor + 8);
      (fun->super__Function_base)._M_manager = (_Manager_type)0x0;
      fun->_M_invoker = (_Invoker_type)0x0;
      local_168 = p_Var1;
    }
    ::std::__cxx11::string::string((string *)&local_70,(string *)flag_description);
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8._M_unused._M_object = (void *)0x0;
    local_d8._8_8_ = 0;
    this_00 = add_option(this,&local_118,(callback_t *)&local_178,&local_70,false,
                         (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                          *)&local_d8);
    std::_Function_base::~_Function_base((_Function_base *)&local_d8);
    ::std::__cxx11::string::~string((string *)&local_70);
    std::_Function_base::~_Function_base((_Function_base *)&local_178);
    ::std::__cxx11::string::~string((string *)&local_118);
  }
  if ((this_00->pname_)._M_string_length == 0) {
    Option::multi_option_policy(this_00,TakeLast);
    this_00->expected_min_ = 0;
    this_00->expected_max_ = 0;
    this_00->flag_like_ = true;
    (this_00->super_OptionBase<CLI::Option>).required_ = false;
    return this_00;
  }
  Option::get_name_abi_cxx11_((string *)&flag_defaults,this_00,true,false);
  remove_option(this,this_00);
  __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  ::std::__cxx11::string::string((string *)&local_90,(string *)&flag_defaults);
  IncorrectConstruction::PositionalFlag(__return_storage_ptr__,&local_90);
  __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

CLI11_INLINE Option *App::_add_flag_internal(std::string flag_name, CLI::callback_t fun, std::string flag_description) {
    Option *opt = nullptr;
    if(detail::has_default_flag_values(flag_name)) {
        // check for default values and if it has them
        auto flag_defaults = detail::get_default_flag_values(flag_name);
        detail::remove_default_flag_values(flag_name);
        opt = add_option(std::move(flag_name), std::move(fun), std::move(flag_description), false);
        for(const auto &fname : flag_defaults)
            opt->fnames_.push_back(fname.first);
        opt->default_flag_values_ = std::move(flag_defaults);
    } else {
        opt = add_option(std::move(flag_name), std::move(fun), std::move(flag_description), false);
    }
    // flags cannot have positional values
    if(opt->get_positional()) {
        auto pos_name = opt->get_name(true);
        remove_option(opt);
        throw IncorrectConstruction::PositionalFlag(pos_name);
    }
    opt->multi_option_policy(MultiOptionPolicy::TakeLast);
    opt->expected(0);
    opt->required(false);
    return opt;
}